

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name-component.c
# Opt level: O3

void name_component_print(name_component_t *component)

{
  uint32_t uVar1;
  uint64_t uVar2;
  char *__format;
  ulong uVar3;
  
  uVar1 = component->type;
  if (0x22 < (int)uVar1) {
    if (uVar1 == 0x23) {
      __format = "/v=%lu";
    }
    else if (uVar1 == 0x24) {
      __format = "/t=%lu";
    }
    else {
      if (uVar1 != 0x25) goto LAB_0010de4a;
      __format = "/seq=%lu";
    }
    uVar2 = _turn_component_to_uint_value(component);
    printf(__format,uVar2);
    return;
  }
  if (uVar1 == 1) {
    printf("/sha256digiest=0x");
    if (component->size == '\0') {
      return;
    }
    uVar3 = 0;
    do {
      printf("%02x",(ulong)component->value[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar3 < component->size);
    return;
  }
  if (uVar1 == 2) {
    printf("/params-sha256=0x");
    if (component->size == '\0') {
      return;
    }
    uVar3 = 0;
    do {
      printf("%02x",(ulong)component->value[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar3 < component->size);
    return;
  }
LAB_0010de4a:
  putchar(0x2f);
  if (component->size != '\0') {
    uVar3 = 0;
    do {
      if ((byte)(component->value[uVar3] - 0x21) < 0x5d) {
        putchar((uint)component->value[uVar3]);
      }
      else {
        printf("0x%02x");
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < component->size);
  }
  return;
}

Assistant:

void
name_component_print(const name_component_t* component)
{
  switch (component->type) {
    case TLV_ImplicitSha256DigestComponent:
      printf("/sha256digiest=0x");
      for (int j = 0; j < component->size; j++) {
        printf("%02x", component->value[j]);
      }
      break;

    case TLV_ParametersSha256DigestComponent:
      printf("/params-sha256=0x");
      for (int j = 0; j < component->size; j++) {
        printf("%02x", component->value[j]);
      }
      break;

    case TLV_VersionNameComponent:
      printf("/v=%" PRIu64 "", name_component_to_version(component));
      break;

    case TLV_TimestampNameComponent:
      printf("/t=%" PRI_ndn_time_us_t "", name_component_to_timestamp(component));
      break;

    case TLV_SequenceNumNameComponent:
      printf("/seq=%" PRIu64 "", name_component_to_sequence_num(component));
      break;

    default:
      printf("/");
      for (int j = 0; j < component->size; j++) {
        if (component->value[j] >= 33 && component->value[j] < 126) {
          printf("%c", component->value[j]);
        }
        else {
          printf("0x%02x", component->value[j]);
        }
      }
      break;
  }
}